

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *fname;
  MOJOSHADER_error *pMVar1;
  MOJOSHADER_effectObject *pMVar2;
  char *pcVar3;
  FILE *__stream;
  uchar *buf;
  size_t sVar4;
  MOJOSHADER_effect *_effect;
  MOJOSHADER_parseData *pd;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  MOJOSHADER_effectTechnique *pMVar10;
  char *pcVar11;
  int iVar12;
  uint uVar13;
  int i;
  long lVar14;
  ulong uVar15;
  MOJOSHADER_effectPass *pMVar16;
  ulong uVar17;
  MOJOSHADER_effectParam *value;
  MOJOSHADER_effectState *pMVar18;
  ulong uVar19;
  
  puts("MojoShader testparse");
  printf("Compiled against changeset %s\n","???");
  pcVar3 = MOJOSHADER_changeset();
  printf("Linked against changeset %s\n",pcVar3);
  putchar(10);
  if (argc < 3) {
    iVar6 = 0;
    printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n",*argv);
  }
  else {
    pcVar3 = argv[1];
    uVar17 = 2;
    iVar6 = 0;
    do {
      __stream = fopen(argv[uVar17],"rb");
      if (__stream == (FILE *)0x0) {
        printf(" ... fopen(\'%s\') failed.\n",argv[uVar17]);
      }
      else {
        buf = (uchar *)malloc(1000000);
        sVar4 = fread(buf,1,1000000,__stream);
        fclose(__stream);
        fname = argv[uVar17];
        if (*buf == 0xcf) {
          if (((buf[1] == '\v') && (buf[2] == 0xf0)) && (buf[3] == 0xbc)) goto LAB_00107478;
LAB_00107554:
          pd = MOJOSHADER_parse(pcVar3,(char *)0x0,buf,(uint)sVar4,(MOJOSHADER_swizzle *)0x0,0,
                                (MOJOSHADER_samplerMap *)0x0,0,(MOJOSHADER_malloc)0x0,
                                (MOJOSHADER_free)0x0,(void *)0x0);
          iVar12 = pd->error_count;
          printf("SHADER: %s\n",fname);
          print_shader(fname,pd,1);
          MOJOSHADER_freeParseData(pd);
        }
        else {
          if (((*buf != '\x01') || (buf[1] != '\t')) || ((buf[2] != 0xff || (buf[3] != 0xfe))))
          goto LAB_00107554;
LAB_00107478:
          _effect = MOJOSHADER_parseEffect
                              (pcVar3,buf,(uint)sVar4,(MOJOSHADER_swizzle *)0x0,0,
                               (MOJOSHADER_samplerMap *)0x0,0,(MOJOSHADER_malloc)0x0,
                               (MOJOSHADER_free)0x0,(void *)0x0);
          iVar12 = _effect->error_count;
          printf("EFFECT: %s\n",fname);
          printf("    ");
          printf("PROFILE: %s\n",_effect->profile);
          putchar(10);
          if (_effect->error_count < 1) {
            pMVar10 = _effect->techniques;
            pMVar2 = _effect->objects;
            if (0 < _effect->param_count) {
              value = _effect->params;
              uVar19 = 0;
              do {
                printf("    ");
                printf("PARAM #%d\n",uVar19);
                print_value(&value->value,2);
                if (value->annotation_count != 0) {
                  iVar7 = 2;
                  do {
                    printf("    ");
                    iVar7 = iVar7 + -1;
                  } while (iVar7 != 0);
                  puts("ANNOTATIONS:");
                  if (value->annotation_count != 0) {
                    lVar9 = 0;
                    uVar15 = 0;
                    do {
                      print_value((MOJOSHADER_effectValue *)
                                  ((long)&value->annotations->name + lVar9),3);
                      uVar15 = uVar15 + 1;
                      lVar9 = lVar9 + 0x40;
                    } while (uVar15 < value->annotation_count);
                  }
                }
                uVar13 = (int)uVar19 + 1;
                uVar19 = (ulong)uVar13;
                value = value + 1;
              } while ((int)uVar13 < _effect->param_count);
            }
            putchar(10);
            if (0 < _effect->technique_count) {
              uVar13 = 0;
              do {
                pMVar16 = pMVar10->passes;
                printf("    ");
                printf("TECHNIQUE #%d (\'%s\'):\n",(ulong)uVar13,pMVar10->name);
                if (pMVar10->pass_count != 0) {
                  uVar19 = 0;
                  do {
                    pMVar18 = pMVar16->states;
                    iVar7 = 2;
                    do {
                      printf("    ");
                      iVar7 = iVar7 + -1;
                    } while (iVar7 != 0);
                    printf("PASS #%d (\'%s\'):\n",uVar19,pMVar16->name);
                    if (pMVar16->state_count != 0) {
                      uVar8 = 0;
                      do {
                        iVar7 = 3;
                        do {
                          printf("    ");
                          iVar7 = iVar7 + -1;
                        } while (iVar7 != 0);
                        printf("STATE %d:\n",(ulong)pMVar18->type);
                        print_value(&pMVar18->value,4);
                        uVar8 = uVar8 + 1;
                        pMVar18 = pMVar18 + 1;
                      } while (uVar8 < pMVar16->state_count);
                    }
                    uVar8 = (int)uVar19 + 1;
                    uVar19 = (ulong)uVar8;
                    pMVar16 = pMVar16 + 1;
                  } while (uVar8 < pMVar10->pass_count);
                }
                uVar13 = uVar13 + 1;
                pMVar10 = pMVar10 + 1;
              } while ((int)uVar13 < _effect->technique_count);
            }
            putchar(10);
            if (1 < _effect->object_count) {
              uVar19 = 1;
              do {
                printf("    ");
                switch(pMVar2[1].type) {
                case MOJOSHADER_SYMTYPE_STRING:
                  uVar5 = *(undefined8 *)((long)pMVar2 + 0x50);
                  pcVar11 = "OBJECT #%d: STRING, \'%s\'\n";
                  goto LAB_0010780f;
                case MOJOSHADER_SYMTYPE_TEXTURE:
                case MOJOSHADER_SYMTYPE_TEXTURE1D:
                case MOJOSHADER_SYMTYPE_TEXTURE2D:
                case MOJOSHADER_SYMTYPE_TEXTURE3D:
                case MOJOSHADER_SYMTYPE_TEXTURECUBE:
                  printf("OBJECT #%d: TEXTURE\n",uVar19);
                  break;
                case MOJOSHADER_SYMTYPE_SAMPLER:
                case MOJOSHADER_SYMTYPE_SAMPLER1D:
                case MOJOSHADER_SYMTYPE_SAMPLER2D:
                case MOJOSHADER_SYMTYPE_SAMPLER3D:
                case MOJOSHADER_SYMTYPE_SAMPLERCUBE:
                  uVar5 = *(undefined8 *)((long)pMVar2 + 0x50);
                  pcVar11 = "OBJECT #%d: MAPPING, \'%s\'\n";
LAB_0010780f:
                  printf(pcVar11,uVar19,uVar5);
                  break;
                case MOJOSHADER_SYMTYPE_PIXELSHADER:
                case MOJOSHADER_SYMTYPE_VERTEXSHADER:
                  if (*(int *)((long)pMVar2 + 0x54) == 0) {
                    printf("OBJECT #%d: SHADER, technique %u, pass %u\n",uVar19,
                           (ulong)*(uint *)((long)pMVar2 + 0x4c),
                           (ulong)*(uint *)((long)pMVar2 + 0x50));
                    print_shader(fname,*(MOJOSHADER_parseData **)((long)pMVar2 + 0x88),2);
                  }
                  else {
                    printf("OBJECT #%d: PRESHADER, technique %u, pass %u, param %s\n",uVar19,
                           (ulong)*(uint *)((long)pMVar2 + 0x4c),
                           (ulong)*(uint *)((long)pMVar2 + 0x50));
                    print_preshader(*(MOJOSHADER_preshader **)((long)pMVar2 + 0x88),2);
                  }
                  break;
                default:
                  printf("UNKNOWN OBJECT: #%d\n",uVar19);
                }
                uVar13 = (int)uVar19 + 1;
                uVar19 = (ulong)uVar13;
                pMVar2 = pMVar2 + 1;
              } while ((int)uVar13 < _effect->object_count);
            }
          }
          else {
            lVar9 = 0x10;
            lVar14 = 0;
            do {
              pMVar1 = _effect->errors;
              printf("    ");
              pcVar11 = *(char **)((long)pMVar1 + lVar9 + -8);
              if (pcVar11 == (char *)0x0) {
                pcVar11 = fname;
              }
              printf("%s:%d: ERROR: %s\n",pcVar11,(ulong)*(uint *)((long)&pMVar1->error + lVar9),
                     *(undefined8 *)((long)pMVar1 + lVar9 + -0x10));
              lVar14 = lVar14 + 1;
              lVar9 = lVar9 + 0x18;
            } while (lVar14 < _effect->error_count);
          }
          MOJOSHADER_freeEffect(_effect);
        }
        if (iVar12 != 0) {
          iVar6 = 1;
        }
        free(buf);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uint)argc);
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
    int retval = 0;

    printf("MojoShader testparse\n");
    printf("Compiled against changeset %s\n", MOJOSHADER_CHANGESET);
    printf("Linked against changeset %s\n", MOJOSHADER_changeset());
    printf("\n");

    if (argc <= 2)
        printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n", argv[0]);
    else
    {
        const char *profile = argv[1];
        int i;

        for (i = 2; i < argc; i++)
        {
            FILE *io = fopen(argv[i], "rb");
            if (io == NULL)
                printf(" ... fopen('%s') failed.\n", argv[i]);
            else
            {
                unsigned char *buf = (unsigned char *) malloc(1000000);
                int rc = fread(buf, 1, 1000000, io);
                fclose(io);
                if (!do_parse(argv[i], buf, rc, profile))
                    retval = 1;
                free(buf);
            } // else
        } // for
    } // else

    return retval;
}